

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

BPMNode * bpmnode_create(BPMLists *lists,int weight,uint index,BPMNode *tail)

{
  uint uVar1;
  uint uVar2;
  BPMNode *pBVar3;
  
  if (lists->numfree <= lists->nextfree) {
    if (lists->memsize != 0) {
      uVar2 = 0;
      do {
        lists->memory[uVar2].in_use = 0;
        uVar2 = uVar2 + 1;
      } while (uVar2 != lists->memsize);
    }
    if (lists->listsize != 0) {
      uVar2 = 0;
      do {
        for (pBVar3 = lists->chains0[uVar2]; pBVar3 != (BPMNode *)0x0; pBVar3 = pBVar3->tail) {
          pBVar3->in_use = 1;
        }
        for (pBVar3 = lists->chains1[uVar2]; pBVar3 != (BPMNode *)0x0; pBVar3 = pBVar3->tail) {
          pBVar3->in_use = 1;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != lists->listsize);
    }
    lists->numfree = 0;
    if (lists->memsize != 0) {
      uVar2 = 0;
      do {
        if (lists->memory[uVar2].in_use == 0) {
          uVar1 = lists->numfree;
          lists->numfree = uVar1 + 1;
          lists->freelist[uVar1] = lists->memory + uVar2;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != lists->memsize);
    }
    lists->nextfree = 0;
  }
  uVar2 = lists->nextfree;
  lists->nextfree = uVar2 + 1;
  pBVar3 = lists->freelist[uVar2];
  pBVar3->weight = weight;
  pBVar3->index = index;
  pBVar3->tail = tail;
  return pBVar3;
}

Assistant:

static BPMNode* bpmnode_create(BPMLists* lists, int weight, unsigned index, BPMNode* tail)
{
	unsigned i;
	BPMNode* result;

	/*memory full, so garbage collect*/
	if (lists->nextfree >= lists->numfree)
	{
		/*mark only those that are in use*/
		for (i = 0; i != lists->memsize; ++i) lists->memory[i].in_use = 0;
		for (i = 0; i != lists->listsize; ++i)
		{
			BPMNode* node;
			for (node = lists->chains0[i]; node != 0; node = node->tail) node->in_use = 1;
			for (node = lists->chains1[i]; node != 0; node = node->tail) node->in_use = 1;
		}
		/*collect those that are free*/
		lists->numfree = 0;
		for (i = 0; i != lists->memsize; ++i)
		{
			if (!lists->memory[i].in_use) lists->freelist[lists->numfree++] = &lists->memory[i];
		}
		lists->nextfree = 0;
	}

	result = lists->freelist[lists->nextfree++];
	result->weight = weight;
	result->index = index;
	result->tail = tail;
	return result;
}